

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_> __thiscall
punky::par::Parser::parse_block_statement(Parser *this)

{
  TokenType TVar1;
  _Alloc_hider _Var2;
  BlockStmt *this_00;
  BlockStmt *pBVar3;
  BlockStmt *pBVar4;
  Parser *in_RSI;
  bool bVar5;
  unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_> stmt;
  Token blk_tok;
  _Head_base<0UL,_punky::ast::StmtNode_*,_false> local_90;
  undefined1 local_88 [8];
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_80;
  bool local_60;
  TokenType local_58;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_50;
  bool local_30;
  
  local_58 = (in_RSI->m_curr_tok).m_type;
  local_30 = false;
  bVar5 = (in_RSI->m_curr_tok).m_literal.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged == true;
  if (bVar5) {
    local_50._M_value._M_dataplus._M_p = (_Alloc_hider)((long)&local_50 + 0x10);
    _Var2._M_p = (in_RSI->m_curr_tok).m_literal.
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload._M_value._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,_Var2._M_p,
               _Var2._M_p +
               (in_RSI->m_curr_tok).m_literal.
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ._M_payload._M_value._M_string_length);
  }
  local_30 = bVar5;
  this_00 = (BlockStmt *)operator_new(0x50);
  local_88._0_4_ = local_58;
  local_60 = false;
  bVar5 = local_30 == true;
  if (bVar5) {
    local_80._M_value._M_dataplus._M_p = (_Alloc_hider)((long)&local_80 + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,local_50._M_value._M_dataplus._M_p,
               (pointer)(local_50._M_value._M_string_length +
                        (long)local_50._M_value._M_dataplus._M_p));
  }
  local_60 = bVar5;
  ast::BlockStmt::BlockStmt(this_00,(Token *)local_88);
  if (local_60 == true) {
    local_60 = false;
    if (local_80._M_value._M_dataplus._M_p != (pointer)((long)&local_80 + 0x10U)) {
      operator_delete((void *)local_80._M_value._M_dataplus._M_p,local_80._16_8_ + 1);
    }
  }
  consume(in_RSI);
  do {
    TVar1 = (in_RSI->m_curr_tok).m_type;
    if (TVar1 == RightBrace) {
      pBVar4 = (BlockStmt *)0x0;
      pBVar3 = this_00;
LAB_0010da0c:
      (this->m_lex).m_line._M_dataplus._M_p = (pointer)pBVar3;
      if (pBVar4 != (BlockStmt *)0x0) {
        (*(pBVar4->super_StmtNode).super_AstNode._vptr_AstNode[1])(pBVar4);
      }
      if (local_30 == true) {
        local_30 = false;
        if (local_50._M_value._M_dataplus._M_p != (pointer)((long)&local_50 + 0x10U)) {
          operator_delete((void *)local_50._M_value._M_dataplus._M_p,local_50._16_8_ + 1);
        }
      }
      return (__uniq_ptr_data<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>,_true,_true>
              )(__uniq_ptr_data<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>,_true,_true>
                )this;
    }
    if (TVar1 == EOS) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[36]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &in_RSI->m_errors,(char (*) [36])"Block statement missing closing \'}\'");
      (this->m_lex).m_line._M_dataplus._M_p = (pointer)0x0;
      pBVar3 = (BlockStmt *)0x0;
      pBVar4 = this_00;
      goto LAB_0010da0c;
    }
    parse_statement((Parser *)local_88);
    if (local_88 != (undefined1  [8])0x0) {
      local_90._M_head_impl = (StmtNode *)local_88;
      local_88 = (undefined1  [8])0x0;
      ast::BlockStmt::push_stmt
                (this_00,(unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>
                          *)&local_90);
      if (local_90._M_head_impl != (StmtNode *)0x0) {
        (*((local_90._M_head_impl)->super_AstNode)._vptr_AstNode[1])();
      }
      local_90._M_head_impl = (StmtNode *)0x0;
    }
    consume(in_RSI);
    if (local_88 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_88 + 8))();
    }
  } while( true );
}

Assistant:

auto Parser::parse_block_statement() -> std::unique_ptr<ast::BlockStmt>
{
    auto blk_tok = m_curr_tok;
    auto blk     = std::make_unique<ast::BlockStmt>(blk_tok);
    consume();
    while (!curr_type_is(TokenType::RightBrace))
    {
        if (curr_type_is(TokenType::EOS))
        {
            m_errors.emplace_back("Block statement missing closing '}'");
            return nullptr;
        }
        auto stmt = parse_statement();
        if (stmt)
            blk->push_stmt(std::move(stmt));
        consume();
    }
    return blk;
}